

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_name_unittest.cc
# Opt level: O2

void __thiscall
bssl::ParseNameTest_RFC2253FormatMultiRDN_Test::TestBody
          (ParseNameTest_RFC2253FormatMultiRDN_Test *this)

{
  long lVar1;
  pointer *__ptr;
  uint8_t *puVar2;
  uint8_t *puVar3;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *message;
  char *in_R9;
  Input name_tlv;
  AssertHelper local_d8;
  AssertionResult gtest_ar__1;
  AssertHelper local_c0;
  AssertionResult gtest_ar_;
  string output;
  RDNSequence rdn;
  uint8_t der [70];
  
  puVar2 = 
  "0D1\v0\t\x06\x03U\x04\x06\x13\x02US1\x140\x12\x06\x03U\x04\n\x13\vWidget Inc.1\x1f0\f\x06\x03U\x04\v\x13\x05Sales0\x0f\x06\x03U\x04\x03\x13\bJ. Smith"
  ;
  puVar3 = der;
  for (lVar1 = 0x46; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + 1;
    puVar3 = puVar3 + 1;
  }
  rdn.
  super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rdn.
  super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rdn.
  super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name_tlv.data_.size_ = 0x46;
  name_tlv.data_.data_ = der;
  gtest_ar_.success_ = ParseName(name_tlv,&rdn);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_) {
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    gtest_ar__1.success_ = ConvertToRFC2253(&rdn,&output);
    this_00 = &gtest_ar__1.message_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (gtest_ar__1.success_) {
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_00);
      testing::internal::CmpHelperEQ<char[40],std::__cxx11::string>
                ((internal *)&gtest_ar_,"\"OU=Sales+CN=J. Smith,O=Widget Inc.,C=US\"","output",
                 (char (*) [40])"OU=Sales+CN=J. Smith,O=Widget Inc.,C=US",&output);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = "";
        }
        else {
          message = *(char **)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
                   ,0x121,message);
        testing::internal::AssertHelper::operator=(&local_d8,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
        }
      }
      this_00 = &gtest_ar_.message_;
    }
    else {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                 (AssertionResult *)"ConvertToRFC2253(rdn, &output)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
                 ,0x120,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      ::std::__cxx11::string::~string((string *)&gtest_ar_);
      if (local_d8.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_d8.data_ + 8))();
      }
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    ::std::__cxx11::string::~string((string *)&output);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&output,(internal *)&gtest_ar_,(AssertionResult *)"ParseName(rdn_input, &rdn)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
               ,0x11e,output._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    ::std::__cxx11::string::~string((string *)&output);
    if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  ::std::
  vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ::~vector(&rdn);
  return;
}

Assistant:

TEST(ParseNameTest, RFC2253FormatMultiRDN) {
  const uint8_t der[] = {
      0x30, 0x44, 0x31, 0x0b, 0x30, 0x09, 0x06, 0x03, 0x55, 0x04, 0x06, 0x13,
      0x02, 0x55, 0x53, 0x31, 0x14, 0x30, 0x12, 0x06, 0x03, 0x55, 0x04, 0x0a,
      0x13, 0x0b, 0x57, 0x69, 0x64, 0x67, 0x65, 0x74, 0x20, 0x49, 0x6e, 0x63,
      0x2e, 0x31, 0x1f, 0x30, 0x0c, 0x06, 0x03, 0x55, 0x04, 0x0b, 0x13, 0x05,
      0x53, 0x61, 0x6c, 0x65, 0x73, 0x30, 0x0f, 0x06, 0x03, 0x55, 0x04, 0x03,
      0x13, 0x08, 0x4a, 0x2e, 0x20, 0x53, 0x6d, 0x69, 0x74, 0x68};
  der::Input rdn_input(der);
  RDNSequence rdn;
  ASSERT_TRUE(ParseName(rdn_input, &rdn));
  std::string output;
  ASSERT_TRUE(ConvertToRFC2253(rdn, &output));
  ASSERT_EQ("OU=Sales+CN=J. Smith,O=Widget Inc.,C=US", output);
}